

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,CoreType ctype,int argc,char **argv)

{
  string_view brokerName;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  brokerName._M_str._0_4_ = in_EDX;
  brokerName._M_len = in_RCX;
  brokerName._M_str._4_4_ = in_ESI;
  BrokerApp((BrokerApp *)_Var1._M_str,_Var1._M_len._4_4_,brokerName,(int)_Var1._M_len,
            in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, int argc, char* argv[]):
    BrokerApp(ctype, std::string{}, argc, argv)
{
}